

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O1

void * gdImageWBMPPtr(gdImagePtr im,int *size,int fg)

{
  int iVar1;
  gdIOCtx *out;
  void *pvVar2;
  
  pvVar2 = (void *)0x0;
  out = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out != (gdIOCtx *)0x0) {
    iVar1 = _gdImageWBMPCtx(im,fg,out);
    if (iVar1 == 0) {
      pvVar2 = gdDPExtractData(out,size);
    }
    else {
      pvVar2 = (void *)0x0;
    }
    (*out->gd_free)(out);
  }
  return pvVar2;
}

Assistant:

BGD_DECLARE(void *) gdImageWBMPPtr(gdImagePtr im, int *size, int fg)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx(2048, NULL);
	if (out == NULL) return NULL;
	if (!_gdImageWBMPCtx(im, fg, out)) {
		rv = gdDPExtractData(out, size);
	} else {
		rv = NULL;
	}
	out->gd_free(out);
	return rv;
}